

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XYZFormat.cpp
# Opt level: O0

bool __thiscall OpenMD::XYZFormat::ReadMolecule(XYZFormat *this,istream *ifs)

{
  double dVar1;
  byte bVar2;
  int iVar3;
  long *plVar4;
  size_type sVar5;
  ostream *poVar6;
  char *pcVar7;
  undefined8 *puVar8;
  reference pvVar9;
  Vector3<double> *pVVar10;
  long lVar11;
  Vector3<double> *pVVar12;
  size_t sVar13;
  long *in_RSI;
  long in_RDI;
  undefined1 auVar14 [16];
  streampos ipos;
  double charge;
  size_type decimal;
  double z;
  double y;
  double x;
  char *endptr;
  int atomicNum;
  XYZAtom *atom;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vs;
  StringTokenizer tokenizer;
  uint i;
  size_type location;
  string readTitle;
  stringstream errorMsg;
  uint natoms;
  char buffer [32768];
  undefined6 in_stack_ffffffffffff79b8;
  undefined1 in_stack_ffffffffffff79be;
  undefined1 in_stack_ffffffffffff79bf;
  ElementsTable *in_stack_ffffffffffff79c0;
  value_type *in_stack_ffffffffffff79c8;
  Vector3<double> *in_stack_ffffffffffff79d0;
  size_type in_stack_ffffffffffff79e8;
  string *in_stack_ffffffffffff79f0;
  string *in_stack_ffffffffffff79f8;
  StringTokenizer *in_stack_ffffffffffff7a00;
  StringTokenizer *in_stack_ffffffffffff7a08;
  string local_8388 [32];
  double local_8368;
  string local_8360 [32];
  double local_8340;
  string local_8338 [32];
  double local_8318;
  Vector3<double> *local_8310;
  int local_8304;
  undefined8 *local_8300;
  string local_82f8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_82d8;
  allocator<char> local_82b9;
  string local_82b8 [39];
  allocator<char> local_8291;
  string local_8290 [120];
  string local_8218 [36];
  uint local_81f4;
  locale local_81f0 [8];
  ulong local_81e8;
  allocator<char> local_81d9;
  string local_81d8 [32];
  int local_81b8;
  stringstream local_81a8 [16];
  ostream local_8198 [380];
  uint local_801c;
  char local_8018 [32768];
  long *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_81a8);
  bVar2 = std::ios::operator!((ios *)((long)local_18 + *(long *)(*local_18 + -0x18)));
  if ((bVar2 & 1) == 0) {
    plVar4 = (long *)std::istream::getline((char *)local_18,(long)local_8018);
    bVar2 = std::ios::operator!((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    if ((bVar2 & 1) != 0) {
      strcpy(painCave.errMsg,"Problems reading an XYZ file: Cannot read the first line.\n");
      painCave.isFatal = 1;
      simError();
    }
    iVar3 = __isoc99_sscanf(local_8018,"%d",&local_801c);
    if ((iVar3 == 0) || (local_801c == 0)) {
      strcpy(painCave.errMsg,
             "Problems reading an XYZ file: The first line must contain the number of atoms.\n");
      painCave.isFatal = 1;
      simError();
    }
    std::vector<OpenMD::XYZAtom_*,_std::allocator<OpenMD::XYZAtom_*>_>::reserve
              ((vector<OpenMD::XYZAtom_*,_std::allocator<OpenMD::XYZAtom_*>_> *)
               in_stack_ffffffffffff79f0,in_stack_ffffffffffff79e8);
    plVar4 = (long *)std::istream::getline((char *)local_18,(long)local_8018);
    bVar2 = std::ios::operator!((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    if ((bVar2 & 1) != 0) {
      strcpy(painCave.errMsg,
             "Problems reading an XYZ file: Could not read the second line (title/comments).\n");
      painCave.isFatal = 1;
      simError();
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_ffffffffffff7a00->tokenString_,(char *)in_stack_ffffffffffff79f8,
               (allocator<char> *)in_stack_ffffffffffff79f0);
    std::allocator<char>::~allocator(&local_81d9);
    local_81e8 = std::__cxx11::string::find((char *)local_81d8,0x2f836f);
    if (local_81e8 != 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)local_81d8,local_81e8);
    }
    std::locale::locale(local_81f0);
    Utils::trim((string *)in_stack_ffffffffffff79c0,
                (locale *)
                CONCAT17(in_stack_ffffffffffff79bf,
                         CONCAT16(in_stack_ffffffffffff79be,in_stack_ffffffffffff79b8)));
    std::locale::~locale(local_81f0);
    local_81e8 = std::__cxx11::string::find_first_not_of((char *)local_81d8,0x2f05a0);
    if (local_81e8 == -1) {
      std::__cxx11::string::operator=((string *)(in_RDI + 0x18),"");
    }
    else {
      std::__cxx11::string::operator=((string *)(in_RDI + 0x18),local_81d8);
    }
    for (local_81f4 = 1; local_81f4 <= local_801c; local_81f4 = local_81f4 + 1) {
      plVar4 = (long *)std::istream::getline((char *)local_18,(long)local_8018);
      bVar2 = std::ios::operator!((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
      if ((bVar2 & 1) != 0) {
        poVar6 = std::operator<<(local_8198,"Problems reading an XYZ file: ");
        poVar6 = std::operator<<(poVar6,"Could not read line #");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_81f4 + 2);
        poVar6 = std::operator<<(poVar6,", file error.\n");
        poVar6 = std::operator<<(poVar6," According to line one, there should be ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_801c);
        poVar6 = std::operator<<(poVar6," atoms, and therefore ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_801c + 2);
        std::operator<<(poVar6," lines in the file.");
        std::__cxx11::stringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        strcpy(painCave.errMsg,pcVar7);
        std::__cxx11::string::~string(local_8218);
        painCave.isFatal = 0;
        painCave.severity = 2;
        simError();
        local_1 = 0;
        local_81b8 = 1;
        goto LAB_00259d40;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_ffffffffffff7a00->tokenString_,(char *)in_stack_ffffffffffff79f8,
                 (allocator<char> *)in_stack_ffffffffffff79f0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_ffffffffffff7a00->tokenString_,(char *)in_stack_ffffffffffff79f8,
                 (allocator<char> *)in_stack_ffffffffffff79f0);
      StringTokenizer::StringTokenizer
                (in_stack_ffffffffffff7a00,in_stack_ffffffffffff79f8,in_stack_ffffffffffff79f0);
      std::__cxx11::string::~string(local_82b8);
      std::allocator<char>::~allocator(&local_82b9);
      std::__cxx11::string::~string(local_8290);
      std::allocator<char>::~allocator(&local_8291);
      StringTokenizer::getAllTokens_abi_cxx11_(in_stack_ffffffffffff7a08);
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_82d8);
      if (sVar5 < 4) {
        poVar6 = std::operator<<(local_8198,"Problems reading an XYZ file: ");
        poVar6 = std::operator<<(poVar6,"Could not read line #");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_81f4 + 2);
        poVar6 = std::operator<<(poVar6,".\n");
        poVar6 = std::operator<<(poVar6,"OpenBabel found the line \'");
        poVar6 = std::operator<<(poVar6,local_8018);
        poVar6 = std::operator<<(poVar6,"\'\n");
        poVar6 = std::operator<<(poVar6,
                                 "According to the specifications, this line should contain exactly 4 entries, separated by white space.\n"
                                );
        poVar6 = std::operator<<(poVar6,"However, OpenBabel found ");
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_82d8);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar5);
        std::operator<<(poVar6," items.");
        std::__cxx11::stringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        strcpy(painCave.errMsg,pcVar7);
        std::__cxx11::string::~string(local_82f8);
        painCave.isFatal = 0;
        painCave.severity = 2;
        simError();
        local_1 = 0;
        local_81b8 = 1;
      }
      else {
        puVar8 = (undefined8 *)operator_new(0x48);
        puVar8[6] = 0;
        puVar8[7] = 0;
        puVar8[4] = 0;
        puVar8[5] = 0;
        puVar8[2] = 0;
        puVar8[3] = 0;
        *puVar8 = 0;
        puVar8[1] = 0;
        puVar8[8] = 0;
        XYZAtom::XYZAtom((XYZAtom *)in_stack_ffffffffffff79c0);
        local_8300 = puVar8;
        std::vector<OpenMD::XYZAtom_*,_std::allocator<OpenMD::XYZAtom_*>_>::push_back
                  ((vector<OpenMD::XYZAtom_*,_std::allocator<OpenMD::XYZAtom_*>_> *)
                   in_stack_ffffffffffff79d0,in_stack_ffffffffffff79c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_82d8,0);
        std::__cxx11::string::c_str();
        local_8304 = ElementsTable::GetAtomicNum
                               (in_stack_ffffffffffff79c0,
                                (char *)CONCAT17(in_stack_ffffffffffff79bf,
                                                 CONCAT16(in_stack_ffffffffffff79be,
                                                          in_stack_ffffffffffff79b8)));
        if (local_8304 == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_82d8,0);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          local_8304 = atoi(pcVar7);
        }
        *(int *)(local_8300 + 7) = local_8304;
        if (local_8304 == 0) {
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_82d8,0);
          std::__cxx11::string::operator=((string *)(local_8300 + 3),(string *)pvVar9);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_82d8,1);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        local_8318 = strtod(pcVar7,(char **)&local_8310);
        pVVar12 = local_8310;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_82d8,1);
        pVVar10 = (Vector3<double> *)std::__cxx11::string::c_str();
        if (pVVar12 == pVVar10) {
          poVar6 = std::operator<<(local_8198,"Problems reading an XYZ file: ");
          poVar6 = std::operator<<(poVar6,"Could not read line #");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_81f4 + 2);
          poVar6 = std::operator<<(poVar6,".\n");
          poVar6 = std::operator<<(poVar6,"OpenBabel found the line \'");
          poVar6 = std::operator<<(poVar6,local_8018);
          poVar6 = std::operator<<(poVar6,"\'\n");
          poVar6 = std::operator<<(poVar6,
                                   "According to the specifications, this line should contain exactly 4 entries, separated by white space.\n"
                                  );
          std::operator<<(poVar6,"OpenBabel could not interpret item #1 as a number.");
          std::__cxx11::stringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          strcpy(painCave.errMsg,pcVar7);
          std::__cxx11::string::~string(local_8338);
          painCave.isFatal = 1;
          simError();
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_82d8,2);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        local_8340 = strtod(pcVar7,(char **)&local_8310);
        pVVar12 = local_8310;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_82d8,2);
        pVVar10 = (Vector3<double> *)std::__cxx11::string::c_str();
        if (pVVar12 == pVVar10) {
          poVar6 = std::operator<<(local_8198,"Problems reading an XYZ file: ");
          poVar6 = std::operator<<(poVar6,"Could not read line #");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_81f4 + 2);
          poVar6 = std::operator<<(poVar6,".\n");
          poVar6 = std::operator<<(poVar6,"OpenBabel found the line \'");
          poVar6 = std::operator<<(poVar6,local_8018);
          poVar6 = std::operator<<(poVar6,"\'\n");
          poVar6 = std::operator<<(poVar6,
                                   "According to the specifications, this line should contain exactly 4 entries, separated by white space.\n"
                                  );
          std::operator<<(poVar6,"OpenBabel could not interpret item #2 as a number.");
          std::__cxx11::stringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          strcpy(painCave.errMsg,pcVar7);
          std::__cxx11::string::~string(local_8360);
          painCave.isFatal = 1;
          simError();
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_82d8,3);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        local_8368 = strtod(pcVar7,(char **)&local_8310);
        pVVar12 = local_8310;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_82d8,3);
        pVVar10 = (Vector3<double> *)std::__cxx11::string::c_str();
        if (pVVar12 == pVVar10) {
          poVar6 = std::operator<<(local_8198,"Problems reading an XYZ file: ");
          poVar6 = std::operator<<(poVar6,"Could not read line #");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_81f4 + 2);
          in_stack_ffffffffffff7a08 = (StringTokenizer *)std::operator<<(poVar6,".\n");
          in_stack_ffffffffffff7a00 =
               (StringTokenizer *)
               std::operator<<((ostream *)in_stack_ffffffffffff7a08,"OpenBabel found the line \'");
          in_stack_ffffffffffff79f8 =
               (string *)std::operator<<((ostream *)in_stack_ffffffffffff7a00,local_8018);
          in_stack_ffffffffffff79f0 =
               (string *)std::operator<<((ostream *)in_stack_ffffffffffff79f8,"\'\n");
          poVar6 = std::operator<<((ostream *)in_stack_ffffffffffff79f0,
                                   "According to the specifications, this line should contain exactly 4 entries, separated by white space.\n"
                                  );
          std::operator<<(poVar6,"OpenBabel could not interpret item #3 as a number.");
          std::__cxx11::stringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          strcpy(painCave.errMsg,pcVar7);
          std::__cxx11::string::~string(local_8388);
          painCave.isFatal = 0;
          painCave.severity = 2;
          simError();
          local_1 = 0;
          local_81b8 = 1;
        }
        else {
          Vector3<double>::Vector3
                    (in_stack_ffffffffffff79d0,(double)in_stack_ffffffffffff79c8,
                     (double)in_stack_ffffffffffff79c0,
                     (double)CONCAT17(in_stack_ffffffffffff79bf,
                                      CONCAT16(in_stack_ffffffffffff79be,in_stack_ffffffffffff79b8))
                    );
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffff79c0,
                     (Vector3<double> *)
                     CONCAT17(in_stack_ffffffffffff79bf,
                              CONCAT16(in_stack_ffffffffffff79be,in_stack_ffffffffffff79b8)));
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_82d8);
          if (5 < sVar5) {
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&local_82d8,4);
            lVar11 = std::__cxx11::string::find((char)pvVar9,0x2e);
            if (lVar11 != -1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_82d8,4);
              pcVar7 = (char *)std::__cxx11::string::c_str();
              dVar1 = strtod(pcVar7,(char **)&local_8310);
              in_stack_ffffffffffff79d0 = local_8310;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_82d8,4);
              pVVar12 = (Vector3<double> *)std::__cxx11::string::c_str();
              if (in_stack_ffffffffffff79d0 != pVVar12) {
                local_8300[8] = dVar1;
              }
            }
          }
          local_81b8 = 0;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffff79d0);
      StringTokenizer::~StringTokenizer((StringTokenizer *)in_stack_ffffffffffff79c0);
      if (local_81b8 != 0) goto LAB_00259d40;
    }
    std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)0x259c4a);
    do {
      auVar14 = std::istream::tellg();
      std::istream::getline((char *)local_18,(long)local_8018);
      sVar13 = strlen(local_8018);
      bVar2 = 0;
      if (sVar13 == 0) {
        bVar2 = std::ios::eof();
        bVar2 = bVar2 ^ 0xff;
      }
    } while ((bVar2 & 1) != 0);
    std::istream::seekg(local_18,auVar14._0_8_,auVar14._8_8_);
    local_1 = 1;
    local_81b8 = 1;
LAB_00259d40:
    std::__cxx11::string::~string(local_81d8);
  }
  else {
    local_1 = 0;
    local_81b8 = 1;
  }
  std::__cxx11::stringstream::~stringstream(local_81a8);
  return (bool)(local_1 & 1);
}

Assistant:

bool XYZFormat::ReadMolecule(std::istream& ifs) {
    char buffer[BUFF_SIZE];
    unsigned int natoms;
    std::stringstream errorMsg;

    if (!ifs)
      return false;  // we're attempting to read past the end of the file

    if (!ifs.getline(buffer, BUFF_SIZE)) {
      strcpy(painCave.errMsg,
             "Problems reading an XYZ file: Cannot read the first line.\n");
      painCave.isFatal = 1;
      simError();
    }

    if (sscanf(buffer, "%d", &natoms) == 0 || !natoms) {
      strcpy(painCave.errMsg, "Problems reading an XYZ file: The first line "
                              "must contain the number of atoms.\n");
      painCave.isFatal = 1;
      simError();
    }

    mol_.reserve(natoms);

    // The next line contains a title string for the molecule. Use this
    // as the title for the molecule if the line is not
    // empty. Otherwise, use the title given by the calling function.
    if (!ifs.getline(buffer, BUFF_SIZE)) {
      strcpy(painCave.errMsg, "Problems reading an XYZ file: Could not read "
                              "the second line (title/comments).\n");
      painCave.isFatal = 1;
      simError();
    }
    std::string readTitle(buffer);
    std::string::size_type location = readTitle.find("Energy");
    if (location != std::string::npos) readTitle.erase(location);
    Utils::trim(readTitle);

    location = readTitle.find_first_not_of(" \t\n\r");
    if (location != std::string::npos)
      title_ = readTitle;
    else
      title_ = "";

    // The next lines contain four items each, separated by white
    // spaces: the atom type, and the coordinates of the atom
    for (unsigned int i = 1; i <= natoms; i++) {
      if (!ifs.getline(buffer, BUFF_SIZE)) {
        errorMsg << "Problems reading an XYZ file: "
                 << "Could not read line #" << i + 2 << ", file error.\n"
                 << " According to line one, there should be " << natoms
                 << " atoms, and therefore " << natoms + 2
                 << " lines in the file.";

        strcpy(painCave.errMsg, errorMsg.str().c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
        return (false);
      }
      StringTokenizer tokenizer(buffer, " ;,\t\n\r");
      std::vector<std::string> vs = tokenizer.getAllTokens();
      if (vs.size() < 4)  // ignore extra columns which some applications add
      {
        errorMsg << "Problems reading an XYZ file: "
                 << "Could not read line #" << i + 2 << ".\n"
                 << "OpenBabel found the line '" << buffer << "'\n"
                 << "According to the specifications, this line should contain "
                    "exactly 4 entries, separated by white space.\n"
                 << "However, OpenBabel found " << vs.size() << " items.";

        strcpy(painCave.errMsg, errorMsg.str().c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
        return (false);
      }

      // Atom Type: get the atomic number from the element table, using
      // the first entry in the currently read line. If the entry makes
      // sense, set the atomic number and leave the atomic type open
      // (the type is then later faulted in when atom->GetType() is
      // called). If the entry does not make sense to use, set the atom
      // type manually, assuming that the author of the xyz-file had
      // something "special" in mind.

      XYZAtom* atom = new XYZAtom();
      mol_.push_back(atom);

      int atomicNum = etab.GetAtomicNum(vs[0].c_str());
      // set atomic number, or '0' if the atom type is not recognized
      if (atomicNum == 0) {
        // Sometimes people call this an XYZ file, but it's actually Unichem
        // i.e., the first column is the atomic number, not a symbol
        // so we'll first check if we can convert this to an element number
        atomicNum = atoi(vs[0].c_str());
      }

      atom->atomicNum = atomicNum;
      if (atomicNum == 0)  // still strange, try using an atom type
        atom->type = vs[0];

      // Read the atom coordinates
      char* endptr;
      double x = strtod((char*)vs[1].c_str(), &endptr);
      if (endptr == (char*)vs[1].c_str()) {
        errorMsg << "Problems reading an XYZ file: "
                 << "Could not read line #" << i + 2 << ".\n"
                 << "OpenBabel found the line '" << buffer << "'\n"
                 << "According to the specifications, this line should contain "
                    "exactly 4 entries, separated by white space.\n"
                 << "OpenBabel could not interpret item #1 as a number.";

        strcpy(painCave.errMsg, errorMsg.str().c_str());
        painCave.isFatal = 1;
        simError();
      }
      double y = strtod((char*)vs[2].c_str(), &endptr);
      if (endptr == (char*)vs[2].c_str()) {
        errorMsg << "Problems reading an XYZ file: "
                 << "Could not read line #" << i + 2 << ".\n"
                 << "OpenBabel found the line '" << buffer << "'\n"
                 << "According to the specifications, this line should contain "
                    "exactly 4 entries, separated by white space.\n"
                 << "OpenBabel could not interpret item #2 as a number.";

        strcpy(painCave.errMsg, errorMsg.str().c_str());
        painCave.isFatal = 1;
        simError();
      }
      double z = strtod((char*)vs[3].c_str(), &endptr);
      if (endptr == (char*)vs[3].c_str()) {
        errorMsg << "Problems reading an XYZ file: "
                 << "Could not read line #" << i + 2 << ".\n"
                 << "OpenBabel found the line '" << buffer << "'\n"
                 << "According to the specifications, this line should contain "
                    "exactly 4 entries, separated by white space.\n"
                 << "OpenBabel could not interpret item #3 as a number.";

        strcpy(painCave.errMsg, errorMsg.str().c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
        return (false);
      }
      atom->pos = Vector3d(x, y, z);  // set coordinates

      // OK, sometimes there's sym x y z charge -- accepted by Jmol
      if (vs.size() > 5) {
        std::string::size_type decimal = vs[4].find('.');
        if (decimal != std::string::npos) {  // period found
          double charge = strtod((char*)vs[4].c_str(), &endptr);
          if (endptr != (char*)vs[4].c_str()) atom->charge = charge;
        }
      }  // attempt to parse charges
    }

    // clean out any remaining blank lines
    std::streampos ipos;
    do {
      ipos = ifs.tellg();
      ifs.getline(buffer, BUFF_SIZE);
    } while (strlen(buffer) == 0 && !ifs.eof());
    ifs.seekg(ipos);
    return (true);
  }